

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

StringRef * __thiscall
Catch::StringRef::substr
          (StringRef *__return_storage_ptr__,StringRef *this,size_type start,size_type size)

{
  char *pcVar1;
  size_t sVar2;
  Ownership OVar3;
  
  if (start < this->m_size) {
    pcVar1 = this->m_data;
    __return_storage_ptr__->m_data = pcVar1 + start;
    __return_storage_ptr__->m_size = size;
    __return_storage_ptr__->m_ownership = SubStringRef;
    sVar2 = strlen(pcVar1 + start);
    OVar3 = (uint)(size < sVar2);
  }
  else {
    __return_storage_ptr__->m_data = s_emptyStringRef;
    __return_storage_ptr__->m_size = DAT_00169450;
    OVar3 = FullStringRef;
    if (DAT_00169458 != FullStringOwned) {
      OVar3 = DAT_00169458;
    }
  }
  __return_storage_ptr__->m_ownership = OVar3;
  return __return_storage_ptr__;
}

Assistant:

auto StringRef::substr( size_type start, size_type size ) const -> StringRef {
        if( start < m_size )
            return StringRef( m_data+start, size );
            else
                return StringRef();
                }